

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O3

int rewrite_insn(gen_ctx_t gen_ctx,MIR_insn_t insn,MIR_reg_t base_reg,rewrite_data *data)

{
  undefined1 auVar1 [32];
  byte bVar2;
  MIR_reg_t *pMVar3;
  bitmap_t pVVar4;
  void *pvVar5;
  ulong *puVar6;
  bitmap_t pVVar7;
  gen_ctx_t bm;
  VARR_MIR_reg_t *pVVar8;
  undefined8 *puVar9;
  VARR_spill_cache_el_t *pVVar10;
  spill_cache_el_t *psVar11;
  bitmap_t *ppVVar12;
  VARR_live_range_t *pVVar13;
  undefined8 uVar14;
  MIR_op_t op1;
  MIR_op_t op1_00;
  MIR_op_t op2;
  undefined1 auVar15 [32];
  anon_union_32_12_57d33f68_for_u aVar16;
  undefined1 auVar17 [32];
  anon_union_32_12_57d33f68_for_u aVar18;
  undefined1 auVar19 [32];
  anon_union_32_12_57d33f68_for_u aVar20;
  undefined1 auVar21 [32];
  uint uVar22;
  MIR_op_mode_t MVar23;
  int iVar24;
  MIR_type_t MVar25;
  MIR_reg_t MVar26;
  int iVar27;
  int iVar28;
  ra_ctx *prVar29;
  ulong uVar30;
  MIR_insn_t_conflict pMVar31;
  int64_t iVar32;
  MIR_insn_t_conflict insn_00;
  undefined1 (*pauVar33) [32];
  live_range_t_conflict plVar34;
  MIR_error_func_t p_Var35;
  char cVar36;
  int iVar37;
  ulong uVar38;
  MIR_insn_t pMVar39;
  long lVar40;
  MIR_disp_t disp;
  MIR_reg_t base_reg_00;
  int extraout_EDX;
  anon_union_32_12_57d33f68_for_u *paVar41;
  char *pcVar42;
  MIR_context_t bm_00;
  uint uVar43;
  MIR_error_func_t p_Var44;
  ulong uVar45;
  VARR_bitmap_t *pVVar46;
  code *nb;
  ulong uVar47;
  gen_ctx_t gen_ctx_00;
  MIR_context_t pMVar48;
  MIR_context_t pMVar49;
  undefined8 in_R8;
  long lVar50;
  undefined8 in_R9;
  long lVar51;
  undefined8 unaff_R12;
  ulong uVar52;
  MIR_op_t *pMVar53;
  uint uVar54;
  size_t sVar55;
  bool bVar56;
  int out_p;
  MIR_op_t mem_op;
  MIR_reg_t early_clobbered_hard_reg2;
  MIR_reg_t early_clobbered_hard_reg1;
  MIR_op_t out_op;
  MIR_op_t in_op;
  MIR_reg_t MStack_358;
  MIR_op_t MStack_310;
  bitmap_t pVStack_2d8;
  ulong uStack_2d0;
  rewrite_data *prStack_2c8;
  ulong uStack_2c0;
  gen_ctx_t pgStack_2b8;
  code *pcStack_2b0;
  uint local_1ec;
  uint local_1e8;
  int local_1e4;
  anon_union_32_12_57d33f68_for_u *local_1e0;
  MIR_op_t *local_1d8;
  MIR_insn_t_conflict local_1d0;
  size_t local_1c8;
  MIR_insn_t local_1c0;
  MIR_op_t local_1b8;
  MIR_op_t local_188;
  MIR_op_t local_158;
  void *local_128 [2];
  int64_t iStack_118;
  char *pcStack_110;
  undefined8 uStack_108;
  MIR_disp_t MStack_100;
  void *local_f8;
  MIR_insn_t pMStack_f0;
  MIR_insn_t pMStack_e8;
  undefined8 uStack_e0;
  void *pvStack_d8;
  undefined8 uStack_d0;
  int local_c8 [12];
  undefined1 local_98 [16];
  undefined1 auStack_88 [16];
  undefined1 auStack_78 [16];
  
  pMVar48 = gen_ctx->ctx;
  local_1e0 = (anon_union_32_12_57d33f68_for_u *)0x0;
  pcStack_2b0 = (code *)0x16e61a;
  MIR_new_int_op(pMVar48,0);
  pcStack_2b0 = (code *)0x16e62c;
  MIR_new_int_op(pMVar48,0);
  pcStack_2b0 = (code *)0x16e637;
  local_1c8 = MIR_insn_nops(pMVar48,insn);
  local_1d8 = insn->ops;
  local_1d0 = (MIR_insn_t_conflict)((long)&insn->ops[0].u + 0x14);
  uVar52 = CONCAT71((int7)((ulong)unaff_R12 >> 8),1);
  local_1ec = 0xffffffff;
  local_1e8 = 0xffffffff;
  do {
    if (local_1c8 != 0) {
      sVar55 = 0;
      pMVar31 = local_1d0;
      do {
        pcStack_2b0 = (code *)0x16e6b0;
        MVar23 = MIR_insn_op_mode(pMVar48,insn,sVar55,&local_1e4);
        iVar24 = local_1e4;
        if ((byte)uVar52 != 0) {
          if ((local_1e4 != 0) &&
             (cVar36 = *(char *)((long)&pMVar31[-1].ops[0].u + 4), cVar36 != '\v'))
          goto LAB_0016e6e9;
          goto LAB_0016eae5;
        }
        cVar36 = *(char *)((long)&pMVar31[-1].ops[0].u + 4);
        if (local_1e4 == 0) {
          iVar24 = 0;
        }
        else if (cVar36 != '\v') goto LAB_0016eae5;
LAB_0016e6e9:
        if (cVar36 != '\v') {
          if (cVar36 != '\x02') goto LAB_0016eae5;
          uVar54 = pMVar31[-1].ops[0].u.mem.nloc;
          uVar30 = (ulong)uVar54;
          if (uVar30 < 0x22) {
            pVVar4 = gen_ctx->func_used_hard_regs;
            pcStack_2b0 = (code *)0x16e725;
            bitmap_expand(pVVar4,uVar30 + 1);
            if (pVVar4 != (bitmap_t)0x0) {
              *pVVar4->varr = *pVVar4->varr | 1L << (uVar30 & 0x3f);
              if (data != (rewrite_data *)0x0) {
                pcStack_2b0 = (code *)0x16e757;
                update_live(pMVar31[-1].ops[0].u.mem.nloc,local_1e4,data->live);
              }
              goto LAB_0016eae5;
            }
LAB_0016fce6:
            pcStack_2b0 = (code *)0x16fceb;
            rewrite_insn_cold_9();
            goto LAB_0016fceb;
          }
          if (iVar24 == 0) {
            pVVar8 = gen_ctx->ra_ctx->reg_renumber;
            if (((pVVar8 != (VARR_MIR_reg_t *)0x0) && (pVVar8->varr != (MIR_reg_t *)0x0)) &&
               (uVar30 < pVVar8->els_num)) {
              local_1e0 = (anon_union_32_12_57d33f68_for_u *)
                          (ulong)((int)local_1e0 +
                                 (uint)(MVar23 - MIR_OP_REF < 0xfffffffd &&
                                       0x21 < pVVar8->varr[uVar30]));
              goto LAB_0016e909;
            }
LAB_0016fce1:
            pcStack_2b0 = (code *)0x16fce6;
            rewrite_insn_cold_8();
            goto LAB_0016fce6;
          }
LAB_0016e909:
          if (data == (rewrite_data *)0x0) goto LAB_0016eae5;
          pcStack_2b0 = (code *)0x16e91a;
          update_live(uVar54,iVar24,data->live);
          pVVar4 = data->regs_to_save;
          if (pVVar4 != (bitmap_t)0x0) {
            uVar54 = pMVar31[-1].ops[0].u.mem.nloc;
            uVar30 = (ulong)uVar54;
            if ((pVVar4->els_num << 6 <= uVar30) ||
               (uVar54 = uVar54 >> 6, uVar47 = pVVar4->varr[uVar54],
               pVVar4->varr[uVar54] = uVar47 & ~(1L << (uVar30 & 0x3f)),
               (uVar47 >> (uVar30 & 0x3f) & 1) == 0)) goto LAB_0016eae5;
            MVar26 = pMVar31[-1].ops[0].u.mem.nloc;
LAB_0016eac5:
            in_R8 = 1;
            in_R9 = 0;
            pcStack_2b0 = (code *)0x16eae5;
            spill_restore_reg(gen_ctx,MVar26,base_reg,insn,1,0);
            goto LAB_0016eae5;
          }
LAB_0016fcf5:
          pcStack_2b0 = (code *)0x16fcfa;
          rewrite_insn_cold_7();
LAB_0016fcfa:
          pcStack_2b0 = (code *)0x16fcff;
          rewrite_insn_cold_4();
LAB_0016fcff:
          pcStack_2b0 = (code *)0x16fd04;
          rewrite_insn_cold_2();
LAB_0016fd04:
          pcStack_2b0 = (code *)0x16fd09;
          rewrite_insn_cold_1();
          goto LAB_0016fd09;
        }
        uVar30 = (ulong)*(uint *)((long)&pMVar31[-1].ops[0].u + 0x1c);
        if (uVar30 < 0x22) {
          pVVar4 = gen_ctx->func_used_hard_regs;
          pcStack_2b0 = (code *)0x16e788;
          bitmap_expand(pVVar4,uVar30 + 1);
          if (pVVar4 != (bitmap_t)0x0) {
            *pVVar4->varr = *pVVar4->varr | 1L << (uVar30 & 0x3f);
            goto LAB_0016e7aa;
          }
LAB_0016fceb:
          pcStack_2b0 = (code *)0x16fcf0;
          rewrite_insn_cold_6();
LAB_0016fcf0:
          pcStack_2b0 = (code *)0x16fcf5;
          rewrite_insn_cold_5();
          goto LAB_0016fcf5;
        }
LAB_0016e7aa:
        uVar30 = (ulong)*(uint *)&pMVar31->data;
        if (uVar30 < 0x22) {
          pVVar4 = gen_ctx->func_used_hard_regs;
          pcStack_2b0 = (code *)0x16e7cd;
          bitmap_expand(pVVar4,uVar30 + 1);
          if (pVVar4 != (bitmap_t)0x0) {
            *pVVar4->varr = *pVVar4->varr | 1L << (uVar30 & 0x3f);
            goto LAB_0016e7ef;
          }
          goto LAB_0016fcf0;
        }
LAB_0016e7ef:
        uVar54 = *(uint *)((long)&pMVar31[-1].ops[0].u + 0x1c);
        uVar30 = (ulong)uVar54;
        if (uVar30 == 0xffffffff) {
          if (data != (rewrite_data *)0x0) goto LAB_0016ea72;
          goto LAB_0016eae5;
        }
        uVar43 = *(uint *)&pMVar31->data;
        if (0xffffffdc < uVar43 - 0x22 || uVar54 < 0x22) goto LAB_0016e9fb;
        pVVar8 = gen_ctx->ra_ctx->reg_renumber;
        if (((pVVar8 == (VARR_MIR_reg_t *)0x0) ||
            (pMVar3 = pVVar8->varr, pMVar3 == (MIR_reg_t *)0x0)) || (pVVar8->els_num <= uVar30)) {
          pcStack_2b0 = (code *)0x16fce1;
          rewrite_insn_cold_3();
          goto LAB_0016fce1;
        }
        if (0x21 < pMVar3[uVar30]) {
          if (pVVar8->els_num <= (ulong)uVar43) goto LAB_0016fd04;
          if (pMVar3[uVar43] < 0x22) goto LAB_0016e9fb;
          if (local_1e4 == 0) {
            bVar56 = -1 < (int)local_1ec;
            local_1ec = (uint)sVar55;
            uVar22 = local_1e8;
            if (bVar56) goto LAB_0016fd66;
          }
          else {
            bVar56 = -1 < (int)local_1e8;
            local_1e8 = (uint)sVar55;
            uVar22 = local_1ec;
            if (bVar56) goto LAB_0016fd42;
          }
          if ((((int)uVar22 < 0) || (uVar54 != local_1d8[uVar22].u.mem.base)) ||
             (uVar43 != local_1d8[uVar22].u.mem.index)) {
            local_1e0 = (anon_union_32_12_57d33f68_for_u *)(ulong)((int)local_1e0 + 2);
          }
        }
LAB_0016e9fb:
        if (data == (rewrite_data *)0x0) goto LAB_0016eae5;
        pcStack_2b0 = (code *)0x16ea0f;
        update_live(uVar54,0,data->live);
        uVar54 = *(uint *)((long)&pMVar31[-1].ops[0].u + 0x1c);
        uVar30 = (ulong)uVar54;
        if (0x21 < uVar30) {
          pVVar4 = data->regs_to_save;
          if (pVVar4 != (bitmap_t)0x0) {
            if ((uVar30 < pVVar4->els_num << 6) &&
               (uVar54 = uVar54 >> 6, uVar47 = pVVar4->varr[uVar54],
               pVVar4->varr[uVar54] = uVar47 & ~(1L << (uVar30 & 0x3f)),
               (uVar47 >> (uVar30 & 0x3f) & 1) != 0)) {
              in_R8 = 1;
              in_R9 = 0;
              pcStack_2b0 = (code *)0x16ea72;
              spill_restore_reg(gen_ctx,*(MIR_reg_t *)((long)&pMVar31[-1].ops[0].u + 0x1c),base_reg,
                                insn,1,0);
            }
            goto LAB_0016ea72;
          }
          goto LAB_0016fcff;
        }
LAB_0016ea72:
        if (*(MIR_reg_t *)&pMVar31->data != 0xffffffff) {
          pcStack_2b0 = (code *)0x16ea84;
          update_live(*(MIR_reg_t *)&pMVar31->data,0,data->live);
          uVar30 = (ulong)*(uint *)&pMVar31->data;
          if (uVar30 < 0x22) goto LAB_0016eae5;
          pVVar4 = data->regs_to_save;
          if (pVVar4 != (bitmap_t)0x0) {
            if ((uVar30 < pVVar4->els_num << 6) &&
               (uVar54 = *(uint *)&pMVar31->data >> 6, uVar47 = pVVar4->varr[uVar54],
               pVVar4->varr[uVar54] = uVar47 & ~(1L << (uVar30 & 0x3f)),
               (uVar47 >> (uVar30 & 0x3f) & 1) != 0)) {
              MVar26 = *(MIR_reg_t *)&pMVar31->data;
              goto LAB_0016eac5;
            }
            goto LAB_0016eae5;
          }
          goto LAB_0016fcfa;
        }
LAB_0016eae5:
        sVar55 = sVar55 + 1;
        pMVar31 = (MIR_insn_t_conflict)&pMVar31->ops[0].u;
      } while (local_1c8 != sVar55);
    }
    if ((~(byte)uVar52 & 1) == 0 && data != (rewrite_data *)0x0) {
      pcStack_2b0 = (code *)0x16eb29;
      target_get_early_clobbered_hard_regs
                (*(MIR_insn_t *)&insn->field_0x18,(MIR_reg_t *)&local_158,(MIR_reg_t *)&local_188);
      if ((MIR_reg_t)local_158.data != 0xffffffff) {
        pcStack_2b0 = (code *)0x16eb43;
        update_live((MIR_reg_t)local_158.data,1,data->live);
      }
      if ((MIR_reg_t)local_188.data != 0xffffffff) {
        pcStack_2b0 = (code *)0x16eb5d;
        update_live((MIR_reg_t)local_188.data,1,data->live);
      }
      if (0xfffffffc < *(int *)&insn->field_0x18 - 0xaaU) {
        pVVar4 = gen_ctx->call_used_hard_regs[0x12];
        if (pVVar4 == (bitmap_t)0x0) goto LAB_0016fd3d;
        pvVar5 = insn->data;
        uVar30 = pVVar4->els_num;
        if (uVar30 != 0) {
          uVar38 = 0;
          uVar47 = 0;
          do {
            while ((pVVar4->varr[uVar38] == 0 ||
                   (uVar45 = pVVar4->varr[uVar38] >> (uVar47 & 0x3f), uVar45 == 0))) {
              uVar38 = uVar38 + 1;
              uVar47 = uVar38 * 0x40;
              if (uVar30 == uVar38) goto LAB_0016ebfd;
            }
            uVar30 = uVar45 & 1;
            uVar38 = uVar47;
            while (uVar30 == 0) {
              uVar38 = uVar38 + 1;
              uVar30 = uVar45 & 2;
              uVar45 = uVar45 >> 1;
            }
            uVar47 = uVar38 + 1;
            pcStack_2b0 = (code *)0x16ebee;
            update_live((MIR_reg_t)uVar38,1,data->live);
            uVar30 = pVVar4->els_num;
            uVar38 = uVar47 >> 6;
          } while (uVar38 < uVar30);
        }
LAB_0016ebfd:
        puVar6 = *(ulong **)((long)pvVar5 + 0x48);
        if (puVar6 != (ulong *)0x0) {
          uVar30 = *puVar6;
          if (uVar30 != 0) {
            uVar38 = 0;
            uVar47 = 0;
            do {
              while ((uVar45 = *(ulong *)(puVar6[2] + uVar38 * 8), uVar45 == 0 ||
                     (uVar45 = uVar45 >> (uVar47 & 0x3f), uVar45 == 0))) {
                uVar38 = uVar38 + 1;
                uVar47 = uVar38 * 0x40;
                if (uVar30 == uVar38) goto LAB_0016ec80;
              }
              uVar30 = uVar45 & 1;
              uVar38 = uVar47;
              while (uVar30 == 0) {
                uVar38 = uVar38 + 1;
                uVar30 = uVar45 & 2;
                uVar45 = uVar45 >> 1;
              }
              uVar47 = uVar38 + 1;
              pcStack_2b0 = (code *)0x16ec71;
              update_live((MIR_reg_t)uVar38,0,data->live);
              uVar30 = *puVar6;
              uVar38 = uVar47 >> 6;
            } while (uVar38 < uVar30);
          }
LAB_0016ec80:
          pVVar4 = data->live;
          if (pVVar4 != (bitmap_t)0x0) {
            uVar30 = pVVar4->els_num;
            if (uVar30 != 0) {
              uVar38 = 0;
              uVar47 = 0;
              do {
                while ((pVVar4->varr[uVar38] == 0 ||
                       (uVar45 = pVVar4->varr[uVar38] >> (uVar47 & 0x3f), uVar45 == 0))) {
                  uVar38 = uVar38 + 1;
                  uVar47 = uVar38 * 0x40;
                  if (uVar30 == uVar38) goto LAB_0016ee44;
                }
                uVar30 = uVar45 & 1;
                while (uVar30 == 0) {
                  uVar47 = uVar47 + 1;
                  uVar30 = uVar45 & 2;
                  uVar45 = uVar45 >> 1;
                }
                if (uVar47 < 0x22) goto LAB_0016ee26;
                pVVar7 = data->bb->gen;
                if (pVVar7 == (bitmap_t)0x0) {
                  pcStack_2b0 = (code *)0x16fdc8;
                  rewrite_insn_cold_13();
                  goto LAB_0016fdc8;
                }
                uVar30 = uVar47 & 0xffffffff;
                uVar54 = (uint)uVar47;
                if ((pVVar7->els_num << 6 <= uVar30) ||
                   ((pVVar7->varr[uVar30 >> 6] >> (uVar47 & 0x3f) & 1) == 0)) {
                  pVVar8 = gen_ctx->ra_ctx->reg_renumber;
                  if ((pVVar8 == (VARR_MIR_reg_t *)0x0) ||
                     ((pVVar8->varr == (MIR_reg_t *)0x0 || (pVVar8->els_num <= uVar30)))) {
                    pcStack_2b0 = (code *)0x16fd66;
                    rewrite_insn_cold_12();
LAB_0016fd66:
                    pcStack_2b0 = (code *)0x16fd85;
                    __assert_fail("in_mem_op_num < 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                  ,0x1f5f,
                                  "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                                 );
                  }
                  pMVar39 = (MIR_insn_t)(ulong)pVVar8->varr[uVar30];
                  if (pMVar39 < (MIR_insn_t)0x22) {
                    pcStack_2b0 = (code *)0x16ed85;
                    local_1c0 = pMVar39;
                    MIR_reg_type(gen_ctx->ctx,uVar54 - 0x21,(gen_ctx->curr_func_item->u).func);
                    pVVar7 = gen_ctx->call_used_hard_regs[0x12];
                    if (pVVar7 == (bitmap_t)0x0) {
                      pcStack_2b0 = (code *)0x16fdfe;
                      rewrite_insn_cold_11();
                      goto LAB_0016fdfe;
                    }
                    pMVar39 = (MIR_insn_t)(pVVar7->els_num << 6);
                    if ((local_1c0 < pMVar39) &&
                       ((*pVVar7->varr >> ((ulong)local_1c0 & 0x3f) & 1) != 0)) {
                      bm = (gen_ctx_t)data->regs_to_save;
                      sVar55 = uVar30 + 1;
                      pcStack_2b0 = (code *)0x16edce;
                      gen_ctx_00 = bm;
                      bitmap_expand((bitmap_t)bm,sVar55);
                      iVar24 = (int)in_R8;
                      iVar27 = (int)in_R9;
                      if (bm == (gen_ctx_t)0x0) {
                        pcStack_2b0 = spill_restore_reg;
                        rewrite_insn_cold_10();
                        pMVar48 = gen_ctx_00->ctx;
                        MVar26 = (int)sVar55 - 0x21;
                        pVStack_2d8 = pVVar4;
                        uStack_2d0 = uVar52;
                        prStack_2c8 = data;
                        uStack_2c0 = uVar47;
                        pgStack_2b8 = bm;
                        pcStack_2b0 = (code *)uVar30;
                        MVar25 = MIR_reg_type(pMVar48,MVar26,(gen_ctx_00->curr_func_item->u).func);
                        if (MVar25 == MIR_T_F) {
                          MVar23 = MIR_OP_FLOAT;
                        }
                        else if (MVar25 == MIR_T_D) {
                          MVar23 = MIR_OP_DOUBLE;
                        }
                        else {
                          MVar23 = (uint)(MVar25 == MIR_T_LD) * 4 + MIR_OP_INT;
                        }
                        prVar29 = gen_ctx_00->ra_ctx;
                        pVVar8 = prVar29->reg_renumber;
                        if (((pVVar8 == (VARR_MIR_reg_t *)0x0) || (pVVar8->varr == (MIR_reg_t *)0x0)
                            ) || (uVar52 = sVar55 & 0xffffffff, pVVar8->els_num <= uVar52))
                        goto LAB_0017022a;
                        uVar54 = pVVar8->varr[uVar52];
                        if (0x21 < uVar54) goto LAB_00170258;
                        pVVar46 = prVar29->used_locs;
                        if (pVVar46 == (VARR_bitmap_t *)0x0) {
                          spill_restore_reg_cold_6();
LAB_0017027c:
                          spill_restore_reg_cold_5();
                        }
                        else {
                          pVVar10 = prVar29->spill_cache;
                          if (pVVar10 == (VARR_spill_cache_el_t *)0x0) goto LAB_0017027c;
                          if (((int)sVar55 == -1) || (pVVar10->els_num <= uVar52))
                          goto LAB_0017022f;
                          psVar11 = pVVar10->varr;
                          if (psVar11[uVar52].age == prVar29->spill_cache_age) {
                            MStack_358 = psVar11[uVar52].slot;
                            goto LAB_0017019a;
                          }
                          pVVar4 = prVar29->conflict_locs1;
                          if ((pVVar4 != (bitmap_t)0x0) && (pVVar4->varr != (bitmap_el_t *)0x0)) {
                            ppVVar12 = pVVar46->varr;
                            pMVar48 = gen_ctx_00->ctx;
                            pVVar4->els_num = 0;
                            pVVar13 = gen_ctx_00->lr_ctx->var_live_ranges;
                            if ((pVVar13 == (VARR_live_range_t *)0x0) ||
                               ((pVVar13->varr == (live_range_t_conflict *)0x0 ||
                                (pVVar13->els_num <= uVar52)))) {
                              spill_restore_reg_cold_3();
                            }
                            else {
                              for (plVar34 = pVVar13->varr[uVar52];
                                  plVar34 != (live_range_t_conflict)0x0; plVar34 = plVar34->next) {
                                if (plVar34->start <= plVar34->finish) {
                                  lVar40 = (long)plVar34->start + -1;
                                  do {
                                    bitmap_ior(pVVar4,pVVar4,ppVVar12[lVar40 + 1]);
                                    lVar40 = lVar40 + 1;
                                  } while (lVar40 < plVar34->finish);
                                }
                              }
                              MVar25 = MIR_reg_type(pMVar48,MVar26,
                                                    (gen_ctx_00->curr_func_item->u).func);
                              MStack_358 = get_stack_loc(gen_ctx_00,
                                                         gen_ctx_00->ra_ctx->start_mem_loc,MVar25,
                                                         pVVar4,(int *)&MStack_310);
                              psVar11[uVar52].slot = MStack_358;
                              psVar11[uVar52].age = gen_ctx_00->ra_ctx->spill_cache_age;
                              pVVar13 = gen_ctx_00->lr_ctx->var_live_ranges;
                              if (((pVVar13 != (VARR_live_range_t *)0x0) &&
                                  (pVVar13->varr != (live_range_t_conflict *)0x0)) &&
                                 (uVar52 < pVVar13->els_num)) {
                                plVar34 = pVVar13->varr[uVar52];
                                if (plVar34 != (live_range_t_conflict)0x0) {
                                  do {
                                    iVar28 = plVar34->finish;
                                    lVar40 = (long)plVar34->start;
                                    if (plVar34->start <= iVar28) {
                                      do {
                                        uVar52 = (ulong)(uint)MStack_310.data;
                                        MVar26 = MStack_358;
                                        if (0 < (int)(uint)MStack_310.data) {
                                          do {
                                            pVVar4 = ppVVar12[lVar40];
                                            bitmap_expand(pVVar4,(ulong)MVar26 + 1);
                                            if (pVVar4 == (bitmap_t)0x0) {
                                              spill_restore_reg_cold_1();
                                              goto LAB_0017022a;
                                            }
                                            pVVar4->varr[MVar26 >> 6] =
                                                 pVVar4->varr[MVar26 >> 6] |
                                                 1L << ((ulong)MVar26 & 0x3f);
                                            MVar26 = MVar26 + 1;
                                            uVar52 = uVar52 - 1;
                                          } while (uVar52 != 0);
                                          iVar28 = plVar34->finish;
                                        }
                                        bVar56 = lVar40 < iVar28;
                                        lVar40 = lVar40 + 1;
                                      } while (bVar56);
                                    }
                                    plVar34 = plVar34->next;
                                  } while (plVar34 != (live_range_t)0x0);
                                }
LAB_0017019a:
                                if (((FILE *)gen_ctx_00->debug_file != (FILE *)0x0) &&
                                   (1 < gen_ctx_00->debug_level)) {
                                  pcVar42 = "Restore";
                                  if (iVar27 == 0) {
                                    pcVar42 = "Spill";
                                  }
                                  fprintf((FILE *)gen_ctx_00->debug_file,"    %s r%d:",pcVar42,
                                          sVar55);
                                }
                                MVar26 = add_ld_st(gen_ctx_00,&MStack_310,MStack_358,base_reg_00,
                                                   MVar23,uVar54,(uint)(iVar27 == 0),10,pMVar39,
                                                   iVar24);
                                return MVar26;
                              }
                            }
                            spill_restore_reg_cold_2();
LAB_00170258:
                            __assert_fail("hard_reg <= ST1_HARD_REG",
                                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                                          ,0x1eb0,
                                          "void spill_restore_reg(gen_ctx_t, MIR_reg_t, MIR_reg_t, MIR_insn_t, int, int)"
                                         );
                          }
                        }
                        iVar27 = (int)pVVar46;
                        iVar24 = (int)sVar55;
                        spill_restore_reg_cold_4();
                        p_Var44 = (MIR_error_func_t)((ulong)pMVar48 & 0xffffffff);
                        if (iVar27 == 0) {
                          nb = p_Var44 + 1;
                          pMVar49 = bm_00;
                          bitmap_expand((bitmap_t)bm_00,(size_t)nb);
                          iVar27 = (int)nb;
                          if (bm_00 != (MIR_context_t)0x0) {
                            p_Var35 = bm_00->error_func;
                            *(ulong *)(p_Var35 + ((ulong)p_Var44 >> 6) * 8) =
                                 *(ulong *)(p_Var35 + ((ulong)p_Var44 >> 6) * 8) |
                                 1L << ((ulong)pMVar48 & 0x3f);
                            goto LAB_001702e7;
                          }
                        }
                        else {
                          if (bm_00 != (MIR_context_t)0x0) {
                            p_Var35 = (MIR_error_func_t)((long)bm_00->gen_ctx << 6);
                            if (p_Var44 < p_Var35) {
                              p_Var35 = bm_00->error_func;
                              bVar2 = (byte)p_Var44 & 0x3f;
                              *(ulong *)(p_Var35 + ((ulong)p_Var44 >> 6) * 8) =
                                   *(ulong *)(p_Var35 + ((ulong)p_Var44 >> 6) * 8) &
                                   (-2L << bVar2 | 0xfffffffffffffffeU >> 0x40 - bVar2);
                            }
LAB_001702e7:
                            return (int)p_Var35;
                          }
                          update_live_cold_1();
                          pMVar49 = pMVar48;
                        }
                        update_live_cold_2();
                        pvVar5 = pMVar49[1].environment_module.data;
                        lVar40 = 0x1e8;
                        uVar52 = (ulong)(iVar24 != 0);
                        if (iVar24 == 0) {
                          lVar40 = 0x188;
                        }
                        iVar24 = *(int *)((long)pvVar5 + uVar52 * 4 + 0x180);
                        lVar50 = (long)iVar24;
                        if (lVar50 < 1) {
                          uVar43 = 0;
                          goto LAB_001703e4;
                        }
                        uVar54 = extraout_EDX - 8;
                        lVar51 = 0;
                        uVar43 = 0;
                        goto LAB_00170360;
                      }
                      pvVar5 = (&bm->curr_func_item->data)[uVar54 >> 6];
                      (&bm->curr_func_item->data)[uVar54 >> 6] =
                           (void *)((ulong)pvVar5 | 1L << (uVar47 & 0x3f));
                      if (((ulong)pvVar5 >> (uVar47 & 0x3f) & 1) == 0) {
                        in_R8 = 1;
                        in_R9 = 1;
                        pcStack_2b0 = (code *)0x16ee26;
                        spill_restore_reg(gen_ctx,uVar54,base_reg,insn,1,1);
                      }
                    }
                  }
                }
LAB_0016ee26:
                uVar30 = pVVar4->els_num;
                uVar47 = uVar47 + 1;
                uVar38 = uVar47 >> 6;
              } while (uVar38 < uVar30);
            }
            goto LAB_0016ee44;
          }
          pcStack_2b0 = (code *)0x16fd38;
          rewrite_insn_cold_14();
        }
        pcStack_2b0 = (code *)0x16fd3d;
        rewrite_insn_cold_15();
LAB_0016fd3d:
        pcStack_2b0 = (code *)0x16fd42;
        rewrite_insn_cold_16();
LAB_0016fd42:
        pcStack_2b0 = (code *)0x16fd61;
        __assert_fail("out_mem_op_num < 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f5b,
                      "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)");
      }
    }
LAB_0016ee44:
    uVar30 = uVar52 & 1;
    uVar52 = 0;
  } while (uVar30 != 0);
  prVar29 = gen_ctx->ra_ctx;
  prVar29->in_reloads_num = 0;
  prVar29->out_reloads_num = 0;
  if ((int)(MIR_reg_t)local_1e0 < 3) {
LAB_0016f25c:
    uVar52 = *(ulong *)&insn->field_0x18;
    if (0xfffffffb < (int)uVar52 - 0x22U) {
      if (*(char *)&insn[1].insn_link.prev != '\x02') {
        pcStack_2b0 = (code *)0x16fe3c;
        __assert_fail("insn->ops[1].mode == MIR_OP_VAR",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f04,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      uVar54 = *(uint *)&insn[1].insn_link.next;
      if (0xffffffdc < uVar54 - 0x22) {
        pcStack_2b0 = (code *)0x16fe5b;
        __assert_fail("reg > ST1_HARD_REG && reg != (4294967295U)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f06,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      pVVar8 = gen_ctx->ra_ctx->reg_renumber;
      if (((pVVar8 == (VARR_MIR_reg_t *)0x0) || (pVVar8->varr == (MIR_reg_t *)0x0)) ||
         (pVVar8->els_num <= (ulong)uVar54)) goto LAB_0016fdd2;
      uVar43 = pVVar8->varr[uVar54];
      pMVar49 = gen_ctx->ctx;
      pcStack_2b0 = (code *)0x16f2c9;
      MVar25 = MIR_reg_type(pMVar49,uVar54 - 0x21,(gen_ctx->curr_func_item->u).func);
      if (uVar43 < 0x22) {
        pcStack_2b0 = (code *)0x16fe7a;
        __assert_fail("loc > ST1_HARD_REG",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                      ,0x1f09,"void transform_addr(gen_ctx_t, MIR_insn_t, MIR_reg_t)");
      }
      uVar43 = uVar43 - 0x22;
      if (gen_ctx->target_ctx->keep_fp_p == '\0') {
        lVar40 = (ulong)uVar43 << 3;
      }
      else {
        lVar40 = -0xb0;
        if (((gen_ctx->curr_func_item->u).func)->vararg_p == '\0') {
          lVar40 = 0;
        }
        lVar40 = lVar40 + (ulong)((MVar25 == MIR_T_LD) + 1 + uVar43) * -8;
      }
      pcStack_2b0 = (code *)0x16f32b;
      MVar26 = get_reload_hreg(gen_ctx,0xffffffff,6,0);
      pcStack_2b0 = (code *)0x16f345;
      _MIR_new_var_op(pMVar49,MVar26);
      pcStack_2b0 = (code *)0x16f350;
      iVar32 = _MIR_addr_offset(pMVar49,*(MIR_insn_code_t *)&insn->field_0x18);
      pcStack_2b0 = (code *)0x16f369;
      MIR_new_int_op(pMVar49,lVar40 + iVar32);
      pcStack_2b0 = (code *)0x16f3a5;
      local_1d0 = MIR_new_insn(pMVar49,MIR_MOV);
      pcStack_2b0 = (code *)0x16f3c2;
      _MIR_new_var_op(pMVar49,MVar26);
      local_1e0 = (anon_union_32_12_57d33f68_for_u *)CONCAT44(local_1e0._4_4_,MVar26);
      pcStack_2b0 = (code *)0x16f3de;
      _MIR_new_var_op(pMVar49,MVar26);
      pcStack_2b0 = (code *)0x16f3f8;
      _MIR_new_var_op(pMVar49,base_reg);
      pMVar31 = local_1d0;
      pcStack_2b0 = (code *)0x16f45e;
      insn_00 = MIR_new_insn(pMVar49,MIR_ADD);
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        if (gen_ctx->optimize_level == 0) {
          uVar54 = *(int *)&insn->field_0x18 - 0xa7;
          pMVar39 = insn;
          if ((uVar54 < 0xe) && ((0x2007U >> (uVar54 & 0x1f) & 1) != 0)) {
            pMVar39 = (MIR_insn_t)insn->data;
          }
        }
        else {
          pMVar39 = (MIR_insn_t)((long)insn->data + 0x30);
        }
        pcStack_2b0 = (code *)0x16f4c2;
        fprintf((FILE *)gen_ctx->debug_file,"    Adding before insn (in BB %lu) ",*pMVar39->data);
        pcStack_2b0 = (code *)0x16f4e6;
        MIR_output_insn(pMVar49,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,0);
        pcStack_2b0 = (code *)0x16f501;
        fwrite(":\n      ",8,1,(FILE *)gen_ctx->debug_file);
        pcStack_2b0 = (code *)0x16f520;
        MIR_output_insn(pMVar49,gen_ctx->debug_file,pMVar31,(gen_ctx->curr_func_item->u).func,1);
        pcStack_2b0 = (code *)0x16f53b;
        fwrite("      ",6,1,(FILE *)gen_ctx->debug_file);
        pcStack_2b0 = (code *)0x16f55a;
        MIR_output_insn(pMVar49,gen_ctx->debug_file,insn_00,(gen_ctx->curr_func_item->u).func,1);
      }
      pcStack_2b0 = (code *)0x16f56c;
      gen_add_insn_before(gen_ctx,insn,pMVar31);
      pcStack_2b0 = (code *)0x16f57a;
      gen_add_insn_before(gen_ctx,insn,insn_00);
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        pcStack_2b0 = (code *)0x16f5a4;
        fwrite("Changing ",9,1,(FILE *)gen_ctx->debug_file);
        pcStack_2b0 = (code *)0x16f5be;
        MIR_output_insn(pMVar49,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,0);
      }
      *(undefined4 *)&insn->field_0x18 = 0;
      pcStack_2b0 = (code *)0x16f5df;
      _MIR_new_var_op(pMVar49,(MIR_reg_t)local_1e0);
      auVar1._16_16_ = auStack_88;
      auVar1._0_16_ = local_98;
      auVar21._16_16_ = auStack_78;
      auVar21._0_16_ = auStack_88;
      *(undefined1 (*) [32])&insn[1].insn_link.next = auVar21;
      insn[1].data = (void *)local_98._0_8_;
      insn[1].insn_link.prev = (MIR_insn_t)SUB168(auVar1._8_16_,0);
      insn[1].insn_link.next = (MIR_insn_t)SUB168(auVar1._8_16_,8);
      *(long *)&insn[1].field_0x18 = auStack_88._8_8_;
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        pcStack_2b0 = (code *)0x16f61c;
        fwrite(" to ",4,1,(FILE *)gen_ctx->debug_file);
        pcStack_2b0 = (code *)0x16f639;
        MIR_output_insn(pMVar49,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,1);
      }
      uVar52 = *(ulong *)&insn->field_0x18;
    }
    if (local_1c8 != 0) {
      local_1e0 = &insn->ops[0].u;
      pMVar31 = (MIR_insn_t_conflict)(ulong)((int)uVar52 - 0xaa);
      sVar55 = 0;
      local_1d0 = pMVar31;
      do {
        pMVar53 = local_1d8 + sVar55;
        pcStack_2b0 = (code *)0x16f69f;
        MVar23 = MIR_insn_op_mode(pMVar48,insn,sVar55,&local_1e4);
        if ((gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          auVar1 = *(undefined1 (*) [32])pMVar53;
          pauVar33 = (undefined1 (*) [32])local_128;
          if (local_1e4 == 0) {
            pauVar33 = (undefined1 (*) [32])&local_f8;
          }
          *(anon_union_32_12_57d33f68_for_u *)(*pauVar33 + 0x10) = pMVar53->u;
          *pauVar33 = auVar1;
        }
        if (pMVar53->field_0x8 == '\v') {
          if (((uint)pMVar31 < 0xfffffffd) || (*(byte *)&pMVar53->u - 0x11 < 0xfffffffb)) {
            MVar26 = *(MIR_reg_t *)((long)&pMVar53->u + 0x10);
            if (0x22 < MVar26 + 1) {
              pcStack_2b0 = (code *)0x16f7dc;
              MVar26 = change_reg(gen_ctx,&local_1b8,MVar26,base_reg,MIR_OP_INT,insn,0);
              *(MIR_reg_t *)((long)&pMVar53->u + 0x10) = MVar26;
              if (MVar26 == 0xffffffff) {
                pcStack_2b0 = (code *)0x16fda4;
                __assert_fail("op->u.var_mem.base != (4294967295U)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1fcc,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
            MVar26 = (pMVar53->u).mem.index;
            if (0x22 < MVar26 + 1) {
              pcStack_2b0 = (code *)0x16f82f;
              MVar26 = change_reg(gen_ctx,&local_1b8,MVar26,base_reg,MIR_OP_INT,insn,0);
              (pMVar53->u).mem.index = MVar26;
              if (MVar26 == 0xffffffff) {
                pcStack_2b0 = (code *)0x16fdc3;
                __assert_fail("op->u.var_mem.index != (4294967295U)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                              ,0x1fd1,
                              "int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)"
                             );
              }
            }
          }
        }
        else if ((pMVar53->field_0x8 == '\x02') && (0x21 < (pMVar53->u).reg)) {
          if (MVar23 == MIR_OP_VAR) {
            if ((*(int *)&insn->field_0x18 != 0xb9) &&
               ((sVar55 != 1 || (3 < *(int *)&insn->field_0x18 - 0x1eU)))) goto LAB_0016fdd7;
            pcStack_2b0 = (code *)0x16f767;
            MVar25 = MIR_reg_type(pMVar48,(pMVar53->u).reg - 0x21,(gen_ctx->curr_func_item->u).func)
            ;
            if (MVar25 == MIR_T_F) {
              MVar23 = MIR_OP_FLOAT;
            }
            else if (MVar25 == MIR_T_D) {
              MVar23 = MIR_OP_DOUBLE;
            }
            else {
              MVar23 = (uint)(MVar25 == MIR_T_LD) * 4 + MIR_OP_INT;
            }
          }
          pVVar8 = gen_ctx->ra_ctx->reg_renumber;
          if (((pVVar8 == (VARR_MIR_reg_t *)0x0) || (pVVar8->varr == (MIR_reg_t *)0x0)) ||
             (pVVar8->els_num <= (ulong)(pMVar53->u).reg)) {
LAB_0016fd09:
            pcStack_2b0 = (code *)0x16fd11;
            rewrite_insn_cold_18();
LAB_0016fd11:
            pcStack_2b0 = (code *)0x16fd33;
            __assert_fail("n < 2",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                          ,0x1ef5,
                          "int try_spilled_reg_mem(gen_ctx_t, MIR_insn_t, int, MIR_reg_t, MIR_reg_t)"
                         );
          }
          if (((sVar55 == 0) && (*(int *)&insn->field_0x18 - 0x22U < 0xfffffffc)) &&
             (uVar54 = pVVar8->varr[(pMVar53->u).reg], 0x21 < uVar54)) {
            pMVar49 = gen_ctx->ctx;
            pcStack_2b0 = (code *)0x16f8ea;
            MVar25 = MIR_reg_type(pMVar49,local_1e0->reg - 0x21,(gen_ctx->curr_func_item->u).func);
            uVar54 = uVar54 - 0x22;
            if (gen_ctx->target_ctx->keep_fp_p == '\0') {
              disp = (ulong)uVar54 << 3;
            }
            else {
              lVar40 = -0xb0;
              if (((gen_ctx->curr_func_item->u).func)->vararg_p == '\0') {
                lVar40 = 0;
              }
              disp = lVar40 + (ulong)((MVar25 == MIR_T_LD) + 1 + uVar54) * -8;
            }
            auVar1 = *(undefined1 (*) [32])local_1d8;
            MVar26 = insn->ops[0].u.reg;
            local_158.u._16_8_ = SUB328((local_1d8->u).mem,0x10);
            local_158.u.mem.disp = (local_1d8->u).mem.disp;
            local_158.data._0_4_ = auVar1._0_4_;
            local_158.data._4_4_ = auVar1._4_4_;
            local_158._8_8_ = auVar1._8_8_;
            local_158.u.i = auVar1._16_8_;
            local_158.u.str.s = auVar1._24_8_;
            pcStack_2b0 = (code *)0x16f98d;
            _MIR_new_var_mem_op(&local_188,pMVar49,MVar25,disp,base_reg,0xffffffff,'\0');
            pMVar31 = local_1d0;
            uVar52 = *(ulong *)&insn->field_0x18;
            if ((int)(uVar52 >> 0x20) < 1) {
              pcStack_2b0 = (code *)0x16fa3c;
              iVar24 = find_insn_pattern(gen_ctx,insn,(int *)0x0);
              pMVar31 = local_1d0;
              if (iVar24 < 0) goto LAB_0016faa5;
            }
            else {
              uVar30 = 0;
              uVar54 = 0;
              paVar41 = local_1e0;
              do {
                if ((*(char *)((long)paVar41 + -8) == '\x02') && (paVar41->reg == MVar26)) {
                  auVar17._4_4_ = local_188.data._4_4_;
                  auVar17._0_4_ = (MIR_reg_t)local_188.data;
                  auVar17._8_8_ = local_188._8_8_;
                  auVar17._16_8_ = local_188.u.i;
                  auVar17._24_8_ = local_188.u.str.s;
                  aVar18.str.s = local_188.u.str.s;
                  aVar18.i = local_188.u.i;
                  aVar18._16_8_ = local_188.u._16_8_;
                  aVar18.mem.disp = local_188.u.mem.disp;
                  *paVar41 = aVar18;
                  *(undefined1 (*) [32])((long)paVar41 + -0x10) = auVar17;
                  if (1 < (int)uVar54) goto LAB_0016fd11;
                  lVar40 = (long)(int)uVar54;
                  uVar54 = uVar54 + 1;
                  local_c8[lVar40] = (int)uVar30;
                }
                uVar30 = uVar30 + 1;
                paVar41 = (anon_union_32_12_57d33f68_for_u *)((long)paVar41 + 0x30);
              } while (uVar52 >> 0x20 != uVar30);
              pcStack_2b0 = (code *)0x16fa19;
              iVar24 = find_insn_pattern(gen_ctx,insn,(int *)0x0);
              if (iVar24 < 0) {
                if (0 < (int)uVar54) {
                  uVar52 = 0;
                  do {
                    iVar24 = local_c8[uVar52];
                    auVar19._4_4_ = local_158.data._4_4_;
                    auVar19._0_4_ = (MIR_reg_t)local_158.data;
                    auVar19._8_8_ = local_158._8_8_;
                    auVar19._16_8_ = local_158.u.i;
                    auVar19._24_8_ = local_158.u.str.s;
                    aVar20.str.s = local_158.u.str.s;
                    aVar20.i = local_158.u.i;
                    aVar20._16_8_ = local_158.u._16_8_;
                    aVar20.mem.disp = local_158.u.mem.disp;
                    uVar52 = uVar52 + 1;
                    local_1d8[iVar24].u = aVar20;
                    *(undefined1 (*) [32])(local_1d8 + iVar24) = auVar19;
                  } while (uVar54 != uVar52);
                }
                goto LAB_0016faa5;
              }
            }
          }
          else {
LAB_0016faa5:
            pcStack_2b0 = (code *)0x16fade;
            MVar26 = change_reg(gen_ctx,&local_1b8,(pMVar53->u).reg,base_reg,MVar23,insn,local_1e4);
            if (MVar26 == 0xffffffff) {
              auVar15._8_8_ = local_1b8._8_8_;
              auVar15._0_8_ = local_1b8.data;
              auVar15._16_8_ = local_1b8.u.i;
              auVar15._24_8_ = local_1b8.u.str.s;
              aVar16.str.s = local_1b8.u.str.s;
              aVar16.i = local_1b8.u.i;
              aVar16._16_8_ = local_1b8.u._16_8_;
              aVar16.mem.disp = local_1b8.u.mem.disp;
              pMVar53->u = aVar16;
              *(undefined1 (*) [32])pMVar53 = auVar15;
            }
            else {
              (pMVar53->u).reg = MVar26;
            }
          }
        }
        sVar55 = sVar55 + 1;
      } while (sVar55 != local_1c8);
      uVar52 = *(ulong *)&insn->field_0x18;
    }
    pMVar53 = local_1d8;
    iVar24 = 0;
    if ((uVar52 & 0xfffffffc) == 0) {
      uVar14 = *(undefined8 *)((long)&local_1d8->u + 8);
      pcStack_2b0 = (code *)0x16fb85;
      op1_00._12_4_ = (int)((ulong)*(undefined8 *)&local_1d8->field_0x8 >> 0x20);
      op1_00.data = local_1d8->data;
      op1_00._8_4_ = *(undefined4 *)&local_1d8->field_0x8;
      op1_00.u.i = (local_1d8->u).i;
      op1_00.u.mem.nonalias = (int)uVar14;
      op1_00.u.mem.nloc = (int)((ulong)uVar14 >> 0x20);
      op1_00.u._16_8_ = *(undefined8 *)((long)&local_1d8->u + 0x10);
      op1_00.u.mem.disp = (local_1d8->u).mem.disp;
      iVar27 = MIR_op_eq_p(pMVar48,op1_00,*(MIR_op_t *)(insn + 1));
      iVar24 = 0;
      if (iVar27 != 0) {
        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          pcStack_2b0 = (code *)0x16fbc7;
          fwrite("Deleting noop move ",0x13,1,(FILE *)gen_ctx->debug_file);
          pcStack_2b0 = (code *)0x16fbe9;
          MIR_output_insn(pMVar48,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,0);
          pcStack_2b0 = (code *)0x16fc03;
          fwrite(" which was ",0xb,1,(FILE *)gen_ctx->debug_file);
          (pMVar53->u).i = iStack_118;
          (pMVar53->u).str.s = pcStack_110;
          *(undefined8 *)((long)&pMVar53->u + 0x10) = uStack_108;
          (pMVar53->u).mem.disp = MStack_100;
          pMVar53->data = local_128[0];
          *(void **)&pMVar53->field_0x8 = local_128[1];
          (pMVar53->u).i = iStack_118;
          (pMVar53->u).str.s = pcStack_110;
          insn[1].insn_link.next = pMStack_e8;
          *(undefined8 *)&insn[1].field_0x18 = uStack_e0;
          insn[1].ops[0].data = pvStack_d8;
          *(undefined8 *)&insn[1].ops[0].field_0x8 = uStack_d0;
          insn[1].data = local_f8;
          insn[1].insn_link.prev = pMStack_f0;
          insn[1].insn_link.next = pMStack_e8;
          *(undefined8 *)&insn[1].field_0x18 = uStack_e0;
          pcStack_2b0 = (code *)0x16fc5d;
          MIR_output_insn(pMVar48,gen_ctx->debug_file,insn,(gen_ctx->curr_func_item->u).func,1);
        }
        if ((((gen_ctx->optimize_level != 0) &&
             (puVar9 = (undefined8 *)insn->data, puVar9 != (undefined8 *)0x0)) &&
            (*(undefined8 **)(puVar9[6] + 0x50) == puVar9)) &&
           (*(undefined8 **)(puVar9[6] + 0x58) == puVar9)) {
          pcStack_2b0 = (code *)0x16fc8e;
          pMVar31 = MIR_new_insn_arr(gen_ctx->ctx,MIR_USE,0,(MIR_op_t *)0x0);
          pcStack_2b0 = (code *)0x16fca4;
          MIR_insert_insn_before
                    (gen_ctx->ctx,gen_ctx->curr_func_item,(MIR_insn_t_conflict)*puVar9,pMVar31);
          pcStack_2b0 = (code *)0x16fcb5;
          add_new_bb_insn(gen_ctx,pMVar31,(bb_t_conflict)puVar9[6],0);
        }
        pcStack_2b0 = (code *)0x16fcc0;
        gen_delete_insn(gen_ctx,insn);
        iVar24 = 1;
      }
    }
    return iVar24;
  }
  if ((int)(local_1ec & local_1e8) < 0) {
LAB_0016fdfe:
    pcStack_2b0 = (code *)0x16fe1d;
    __assert_fail("in_mem_op_num >= 0 || out_mem_op_num >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1ebb,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
  }
  pMVar49 = gen_ctx->ctx;
  uVar52 = (ulong)local_1ec;
  paVar41 = (anon_union_32_12_57d33f68_for_u *)(ulong)local_1e8;
  uVar54 = local_1ec;
  if (-1 < (int)local_1e8) {
    uVar54 = local_1e8;
  }
  uVar30 = (ulong)local_1d8[(int)uVar54].u.mem.base;
  uVar47 = (ulong)local_1d8[(int)uVar54].u.mem.index;
  if (-1 < (int)(local_1ec | local_1e8)) {
    pMVar53 = local_1d8 + uVar52;
    uVar14 = *(undefined8 *)((long)&pMVar53->u + 8);
    pcStack_2b0 = (code *)0x16ef15;
    op1._12_4_ = (int)((ulong)*(undefined8 *)&pMVar53->field_0x8 >> 0x20);
    op1.data = pMVar53->data;
    op1._8_4_ = *(undefined4 *)&pMVar53->field_0x8;
    op1.u.i = (pMVar53->u).i;
    op1.u.mem.nonalias = (int)uVar14;
    op1.u.mem.nloc = (int)((ulong)uVar14 >> 0x20);
    op1.u._16_8_ = *(undefined8 *)((long)&local_1d8[uVar52].u + 0x10);
    op1.u.mem.disp = local_1d8[uVar52].u.mem.disp;
    op2.u._16_8_ = *(undefined8 *)((long)&local_1d8[(long)paVar41].u + 0x10);
    op2._0_32_ = *(undefined1 (*) [32])(local_1d8 + (long)paVar41);
    op2.u.mem.disp = local_1d8[(long)paVar41].u.mem.disp;
    iVar24 = MIR_op_eq_p(pMVar49,op1,op2);
    if (iVar24 == 0) {
      pcStack_2b0 = (code *)0x16fe99;
      __assert_fail("in_mem_op_num < 0 || out_mem_op_num < 0 || MIR_op_eq_p (ctx, ops[in_mem_op_num], ops[out_mem_op_num])"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1ec0,"void reload_addr(gen_ctx_t, MIR_insn_t, int, int, MIR_reg_t)");
    }
    prVar29 = gen_ctx->ra_ctx;
  }
  pVVar8 = prVar29->reg_renumber;
  local_1e0 = paVar41;
  if (((pVVar8 == (VARR_MIR_reg_t *)0x0) || (pVVar8->varr == (MIR_reg_t *)0x0)) ||
     (pVVar8->els_num <= uVar30)) {
LAB_0016fdc8:
    pcStack_2b0 = (code *)0x16fdcd;
    rewrite_insn_cold_20();
  }
  else {
    pcStack_2b0 = (code *)0x16efa3;
    add_ld_st(gen_ctx,&local_158,pVVar8->varr[uVar30],base_reg,MIR_OP_INT,10,0,10,insn,0);
    pMVar53 = local_1d8;
    pVVar8 = gen_ctx->ra_ctx->reg_renumber;
    if (((pVVar8 != (VARR_MIR_reg_t *)0x0) && (pVVar8->varr != (MIR_reg_t *)0x0)) &&
       (uVar47 < pVVar8->els_num)) {
      pcStack_2b0 = (code *)0x16f01f;
      add_ld_st(gen_ctx,&local_158,pVVar8->varr[uVar47],base_reg,MIR_OP_INT,0xb,0,0xb,insn,0);
      pcStack_2b0 = (code *)0x16f034;
      _MIR_new_var_op(pMVar49,10);
      pcStack_2b0 = (code *)0x16f049;
      _MIR_new_var_op(pMVar49,0xb);
      bVar2 = pMVar53[(int)uVar54].u.mem.scale;
      uVar30 = (ulong)bVar2;
      if (bVar2 == 0) {
        iVar32 = -1;
LAB_0016f08a:
        pcStack_2b0 = (code *)0x16f09d;
        MIR_new_int_op(pMVar49,iVar32);
        pcStack_2b0 = (code *)0x16f0ef;
        pMVar31 = MIR_new_insn(pMVar49,MIR_LSH);
        pcStack_2b0 = (code *)0x16f100;
        gen_add_insn_before(gen_ctx,insn,pMVar31);
        if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
          pcStack_2b0 = (code *)0x16f126;
          fwrite("      ",6,1,(FILE *)gen_ctx->debug_file);
          pcStack_2b0 = (code *)0x16f143;
          MIR_output_insn(pMVar49,gen_ctx->debug_file,pMVar31,(gen_ctx->curr_func_item->u).func,1);
        }
      }
      else if (bVar2 != 1) {
        lVar40 = 0;
        uVar47 = uVar30;
        if ((bVar2 & 1) == 0) {
          do {
            lVar40 = lVar40 + 1;
            uVar30 = uVar47 >> 1;
            uVar38 = uVar47 & 2;
            uVar47 = uVar30;
          } while (uVar38 == 0);
        }
        iVar32 = -1;
        if (uVar30 == 1) {
          iVar32 = lVar40;
        }
        goto LAB_0016f08a;
      }
      pcStack_2b0 = (code *)0x16f19c;
      pMVar31 = MIR_new_insn(pMVar49,MIR_ADD);
      pcStack_2b0 = (code *)0x16f1ad;
      gen_add_insn_before(gen_ctx,insn,pMVar31);
      if (((FILE *)gen_ctx->debug_file != (FILE *)0x0) && (1 < gen_ctx->debug_level)) {
        pcStack_2b0 = (code *)0x16f1d3;
        fwrite("      ",6,1,(FILE *)gen_ctx->debug_file);
        pcStack_2b0 = (code *)0x16f1f0;
        MIR_output_insn(pMVar49,gen_ctx->debug_file,pMVar31,(gen_ctx->curr_func_item->u).func,1);
      }
      if (-1 < (int)local_1e8) {
        *(undefined8 *)((long)&local_1d8[(long)local_1e0].u + 0x10) = 0xffffffff0000000a;
      }
      if (-1 < (int)local_1ec) {
        *(undefined8 *)((long)&local_1d8[uVar52].u + 0x10) = 0xffffffff0000000a;
      }
      pcStack_2b0 = (code *)0x16f25c;
      get_reload_hreg(gen_ctx,0xffffffff,6,0);
      goto LAB_0016f25c;
    }
  }
  pcStack_2b0 = (code *)0x16fdd2;
  rewrite_insn_cold_19();
LAB_0016fdd2:
  pcStack_2b0 = (code *)0x16fdd7;
  rewrite_insn_cold_17();
LAB_0016fdd7:
  pcStack_2b0 = (code *)0x16fdf9;
  __assert_fail("insn->code == MIR_USE || (MIR_addr_code_p (insn->code) && i == 1)",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1fb5,"int rewrite_insn(gen_ctx_t, MIR_insn_t, MIR_reg_t, struct rewrite_data *)")
  ;
LAB_00170360:
  if ((iVar27 != -1) && (*(int *)((long)pvVar5 + lVar51 + lVar40 + 4) == iVar27)) {
    return *(int *)((long)pvVar5 + lVar51 + 8 + lVar40);
  }
  iVar28 = *(int *)((long)pvVar5 + lVar51 + lVar40 + 8);
  if (uVar43 == 0) {
    iVar37 = 10;
    if (uVar54 < 3) {
      iVar37 = *(int *)(&DAT_001b1a90 + (ulong)uVar54 * 4);
    }
    uVar22 = 1;
    if (iVar28 != iVar37) goto LAB_00170398;
  }
  else {
LAB_00170398:
    iVar37 = 0xb;
    if (uVar54 < 3) {
      iVar37 = *(int *)(&DAT_001b1a9c + (ulong)uVar54 * 4);
    }
    uVar22 = uVar43;
    if (iVar28 == iVar37) {
      uVar22 = 2;
    }
  }
  uVar43 = uVar22;
  lVar51 = lVar51 + 0xc;
  if (lVar50 * 0xc == lVar51) {
    if (1 < uVar43) {
      __assert_fail("rld_num <= 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                    ,0x1e66,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
    }
LAB_001703e4:
    if (extraout_EDX == 10) {
      iVar28 = -1;
    }
    else {
      if ((extraout_EDX == 9) || (extraout_EDX == 8)) {
        iVar28 = 0x19;
      }
      else {
        iVar28 = 0xb;
      }
      iVar28 = iVar28 - (uint)(uVar43 == 0);
    }
    *(int *)((long)pvVar5 + uVar52 * 4 + 0x180) = iVar24 + 1;
    if (iVar24 < 8) {
      *(int *)((long)pvVar5 + lVar50 * 0xc + lVar40 + 4) = iVar27;
      *(int *)((long)pvVar5 + lVar50 * 0xc + lVar40) = extraout_EDX;
      *(int *)((long)pvVar5 + lVar50 * 0xc + lVar40 + 8) = iVar28;
      return iVar28;
    }
    __assert_fail("rld_num < (2 * 4)",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x1e69,"MIR_reg_t get_reload_hreg(gen_ctx_t, MIR_reg_t, MIR_reg_t, int)");
  }
  goto LAB_00170360;
LAB_0017022a:
  spill_restore_reg_cold_7();
LAB_0017022f:
  __assert_fail("reg != (4294967295U) && reg < (VARR_spill_cache_el_tlength (gen_ctx->ra_ctx->spill_cache))"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                ,0x1e94,"int get_spill_mem_loc(gen_ctx_t, MIR_reg_t)");
}

Assistant:

static int rewrite_insn (gen_ctx_t gen_ctx, MIR_insn_t insn, MIR_reg_t base_reg,
                         struct rewrite_data *data) {
  MIR_context_t ctx = gen_ctx->ctx;
  MIR_type_t type;
  size_t nops, i;
  MIR_op_t *op, mem_op;
#if !MIR_NO_GEN_DEBUG
  MIR_op_t in_op = MIR_new_int_op (ctx, 0),
           out_op = MIR_new_int_op (ctx, 0); /* To remove unitilized warning */
#endif
  MIR_op_mode_t data_mode;
  MIR_reg_t hard_reg, reg;
  int out_p, call_p, addr_reload_p, rld_in_num;
  int out_mem_op_num, in_mem_op_num, other_mem_op_num;
  nops = MIR_insn_nops (ctx, insn);
  out_mem_op_num = in_mem_op_num = -1;
  rld_in_num = 0;
  /* Update live info, save/restore regs living across calls, and check do we need addr reload:
   */
  for (int niter = 0; niter <= 1; niter++) {
    for (i = 0; i < nops; i++) {
      op = &insn->ops[i];
      data_mode = MIR_insn_op_mode (ctx, insn, i, &out_p);
      if (niter == 0 && (!out_p || op->mode == MIR_OP_VAR_MEM)) continue;
      if (niter == 1 && (out_p && op->mode != MIR_OP_VAR_MEM)) continue;
      switch (op->mode) {
      case MIR_OP_VAR:
        if (op->u.var <= MAX_HARD_REG) {
          bitmap_set_bit_p (func_used_hard_regs, op->u.var);
          if (data != NULL) update_live (op->u.var, out_p, data->live);
        } else {
          if (!out_p && VARR_GET (MIR_reg_t, reg_renumber, op->u.var) > MAX_HARD_REG
              && mode2type (data_mode) == MIR_T_I64)
            rld_in_num++;
          if (data != NULL) {
            update_live (op->u.var, out_p, data->live);
            if (bitmap_clear_bit_p (data->regs_to_save, op->u.var)) /* put (slot<-hr) after insn */
              spill_restore_reg (gen_ctx, op->u.var, base_reg, insn, TRUE, FALSE);
          }
        }
        break;
      case MIR_OP_VAR_MEM:
        if (op->u.var_mem.base <= MAX_HARD_REG)
          bitmap_set_bit_p (func_used_hard_regs, op->u.var_mem.base);
        if (op->u.var_mem.index <= MAX_HARD_REG)
          bitmap_set_bit_p (func_used_hard_regs, op->u.var_mem.index);
        if (op->u.var_mem.base != MIR_NON_VAR && op->u.var_mem.index != MIR_NON_VAR
            && op->u.var_mem.base > MAX_HARD_REG && op->u.var_mem.index > MAX_HARD_REG
            && VARR_GET (MIR_reg_t, reg_renumber, op->u.var_mem.base) > MAX_HARD_REG
            && VARR_GET (MIR_reg_t, reg_renumber, op->u.var_mem.index) > MAX_HARD_REG) {
          other_mem_op_num = -1;
          if (out_p) {
            gen_assert (out_mem_op_num < 0);
            out_mem_op_num = (int) i;
            if (in_mem_op_num >= 0) other_mem_op_num = in_mem_op_num;
          } else {
            gen_assert (in_mem_op_num < 0);
            in_mem_op_num = (int) i;
            if (out_mem_op_num >= 0) other_mem_op_num = out_mem_op_num;
          }
          if (other_mem_op_num < 0
              || op->u.var_mem.base != insn->ops[other_mem_op_num].u.var_mem.base
              || op->u.var_mem.index != insn->ops[other_mem_op_num].u.var_mem.index)
            rld_in_num += 2;
        }
        if (data != NULL) {
          if (op->u.var_mem.base != MIR_NON_VAR) {
            update_live (op->u.var_mem.base, FALSE, data->live);
            if (op->u.var_mem.base > MAX_HARD_REG) {
              if (bitmap_clear_bit_p (data->regs_to_save,
                                      op->u.var_mem.base)) /* put slot<-hr after */
                spill_restore_reg (gen_ctx, op->u.var_mem.base, base_reg, insn, TRUE, FALSE);
            }
          }
          if (op->u.var_mem.index != MIR_NON_VAR) {
            update_live (op->u.var_mem.index, FALSE, data->live);
            if (op->u.var_mem.index > MAX_HARD_REG) {
              if (bitmap_clear_bit_p (data->regs_to_save,
                                      op->u.var_mem.index)) /* put slot<-hr after */
                spill_restore_reg (gen_ctx, op->u.var_mem.index, base_reg, insn, TRUE, FALSE);
            }
          }
        }
        break;
      default: /* do nothing */ break;
      }
    }
    if (data != NULL && niter == 0) { /* right after processing outputs */
      MIR_reg_t early_clobbered_hard_reg1, early_clobbered_hard_reg2;
      target_get_early_clobbered_hard_regs (insn, &early_clobbered_hard_reg1,
                                            &early_clobbered_hard_reg2);
      if (early_clobbered_hard_reg1 != MIR_NON_VAR)
        update_live (early_clobbered_hard_reg1, TRUE, data->live);
      if (early_clobbered_hard_reg2 != MIR_NON_VAR)
        update_live (early_clobbered_hard_reg2, TRUE, data->live);
      if (MIR_call_code_p (insn->code)) {
        size_t nel;
        bb_insn_t bb_insn = insn->data;
        bitmap_iterator_t bi;
        FOREACH_BITMAP_BIT (bi, call_used_hard_regs[MIR_T_UNDEF], nel) {
          update_live ((MIR_reg_t) nel, TRUE, data->live);
        }
        FOREACH_BITMAP_BIT (bi, bb_insn->call_hard_reg_args, nel) {
          update_live ((MIR_reg_t) nel, FALSE, data->live);
        }
        FOREACH_BITMAP_BIT (bi, data->live, nel) {
          if (nel <= MAX_HARD_REG) continue;
          reg = (MIR_reg_t) nel;
          if (bitmap_bit_p (data->bb->spill_gen, reg)) continue; /* will be spilled in split */
          MIR_reg_t loc = VARR_GET (MIR_reg_t, reg_renumber, reg);
          if (loc > MAX_HARD_REG) continue;
          type = MIR_reg_type (gen_ctx->ctx, reg - MAX_HARD_REG, curr_func_item->u.func);
          int nregs = target_locs_num (loc, type);
          if (hreg_in_bitmap_p (loc, type, nregs, call_used_hard_regs[MIR_T_UNDEF])
              && bitmap_set_bit_p (data->regs_to_save, reg)) /* put (hr<-slot) after call */
            spill_restore_reg (gen_ctx, reg, base_reg, insn, TRUE, TRUE);
        }
      }
    }
  }
  addr_reload_p = rld_in_num > 2;
  out_reloads_num = in_reloads_num = 0;
  if (addr_reload_p) { /* not enough 2 temp int hard regs: address reload: */
    reload_addr (gen_ctx, insn, in_mem_op_num, out_mem_op_num, base_reg);
    get_reload_hreg (gen_ctx, MIR_NON_VAR, MIR_T_I64,
                     FALSE); /* reserve the 1st int temp hard reg */
  }
  if (MIR_addr_code_p (insn->code)) transform_addr (gen_ctx, insn, base_reg);
  call_p = MIR_call_code_p (insn->code);
  for (i = 0; i < nops; i++) {
    op = &insn->ops[i];
    data_mode = MIR_insn_op_mode (ctx, insn, i, &out_p);
    DEBUG (2, {
      if (out_p)
        out_op = *op; /* we don't care about multiple call outputs here */
      else
        in_op = *op;
    });
    switch (op->mode) {
    case MIR_OP_VAR:
      if (op->u.var <= MAX_HARD_REG) break;
      if (data_mode == MIR_OP_VAR) {
        gen_assert (insn->code == MIR_USE || (MIR_addr_code_p (insn->code) && i == 1));
        type = MIR_reg_type (ctx, op->u.var - MAX_HARD_REG, curr_func_item->u.func);
        data_mode = type == MIR_T_F    ? MIR_OP_FLOAT
                    : type == MIR_T_D  ? MIR_OP_DOUBLE
                    : type == MIR_T_LD ? MIR_OP_LDOUBLE
                                       : MIR_OP_INT;
      }
      MIR_reg_t loc = VARR_GET (MIR_reg_t, reg_renumber, op->u.var);
      if (!MIR_addr_code_p (insn->code) && i == 0 && loc > MAX_HARD_REG
          && try_spilled_reg_mem (gen_ctx, insn, (int) i, loc, base_reg))
        break;
      hard_reg = change_reg (gen_ctx, &mem_op, op->u.var, base_reg, data_mode, insn, out_p);
      if (hard_reg == MIR_NON_VAR) { /* we don't use hard regs for this type reg (e.g. ldouble) */
        *op = mem_op;
      } else {
        op->u.var = hard_reg;
      }
      break;
    case MIR_OP_VAR_MEM:
      if (call_p && MIR_blk_type_p (op->u.var_mem.type)) break;
      if (op->u.var_mem.base > MAX_HARD_REG && op->u.var_mem.base != MIR_NON_VAR) {
        op->u.var_mem.base
          = change_reg (gen_ctx, &mem_op, op->u.var_mem.base, base_reg, MIR_OP_INT, insn, FALSE);
        gen_assert (op->u.var_mem.base != MIR_NON_VAR); /* we can always use GP regs */
      }
      if (op->u.var_mem.index > MAX_HARD_REG && op->u.var_mem.index != MIR_NON_VAR) {
        op->u.var_mem.index
          = change_reg (gen_ctx, &mem_op, op->u.var_mem.index, base_reg, MIR_OP_INT, insn, FALSE);
        gen_assert (op->u.var_mem.index != MIR_NON_VAR); /* we can always use GP regs */
      }
      break;
    default: /* do nothing */ break;
    }
  }
  if (move_code_p (insn->code)) {
    if (MIR_op_eq_p (ctx, insn->ops[0], insn->ops[1])) {
      DEBUG (2, {
        fprintf (debug_file, "Deleting noop move ");
        MIR_output_insn (ctx, debug_file, insn, curr_func_item->u.func, FALSE);
        fprintf (debug_file, " which was ");
        insn->ops[0] = out_op;
        insn->ops[1] = in_op;
        MIR_output_insn (ctx, debug_file, insn, curr_func_item->u.func, TRUE);
      });
      bb_insn_t bb_insn;
      if (optimize_level > 0 && (bb_insn = insn->data) != NULL
          && DLIST_HEAD (bb_insn_t, bb_insn->bb->bb_insns) == bb_insn
          && DLIST_TAIL (bb_insn_t, bb_insn->bb->bb_insns) == bb_insn) { /* avoid empty bb */
        MIR_insn_t nop = MIR_new_insn_arr (gen_ctx->ctx, MIR_USE, 0, NULL);
        MIR_insert_insn_before (gen_ctx->ctx, curr_func_item, bb_insn->insn, nop);
        add_new_bb_insn (gen_ctx, nop, bb_insn->bb, FALSE);
      }
      gen_delete_insn (gen_ctx, insn);
      return 1;
    }
  }
  return 0;
}